

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

lys_module * ly_ctx_get_module_iter(ly_ctx *ctx,uint32_t *idx)

{
  lys_module **pplVar1;
  lys_module *plVar2;
  LY_ERR *pLVar3;
  ulong uVar4;
  
  if (idx == (uint32_t *)0x0 || ctx == (ly_ctx *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
  }
  else {
    uVar4 = (ulong)*idx;
    if (*idx < (uint)(ctx->models).used) {
      pplVar1 = (ctx->models).list;
      do {
        plVar2 = pplVar1[uVar4];
        if ((plVar2->field_0x40 & 0x40) == 0) {
          *idx = (int)uVar4 + 1;
          return plVar2;
        }
        uVar4 = uVar4 + 1;
        *idx = (uint32_t)uVar4;
      } while (uVar4 < (uint)(ctx->models).used);
    }
  }
  return (lys_module *)0x0;
}

Assistant:

lys_module *
ly_ctx_get_module_iter(const struct ly_ctx *ctx, uint32_t *idx)
{
    if (!ctx || !idx) {
        ly_errno = LY_EINVAL;
        return NULL;
    }

    for ( ; *idx < (unsigned)ctx->models.used; (*idx)++) {
        if (!ctx->models.list[(*idx)]->disabled) {
            return ctx->models.list[(*idx)++];
        }
    }

    return NULL;
}